

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O3

void CheckValign(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  Bool BVar1;
  uint code;
  
  if ((attval == (AttVal *)0x0) || (attval->value == (tmbstr)0x0)) {
    code = 0x256;
  }
  else {
    CheckLowerCaseAttrValue(doc,node,attval);
    BVar1 = AttrValueIsAmong(attval,(ctmbstr *)&DAT_001d2900);
    if (BVar1 != no) {
      return;
    }
    BVar1 = AttrValueIsAmong(attval,(ctmbstr *)&DAT_001d2930);
    if (BVar1 == no) {
      BVar1 = AttrValueIsAmong(attval,&PTR_anon_var_dwarf_280bb_001d2950);
      if (BVar1 != no) {
        prvTidyConstrainVersion(doc,0xe000);
        code = 0x26e;
        goto LAB_00139296;
      }
    }
    else if ((node->tag != (Dict *)0x0) && ((node->tag->model & 0x10000) != 0)) {
      return;
    }
    code = 0x22b;
  }
LAB_00139296:
  prvTidyReportAttrError(doc,node,attval,code);
  return;
}

Assistant:

void CheckValign( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    ctmbstr const values[] = {"top", "middle", "bottom", "baseline", NULL};
    ctmbstr const values2[] = {"left", "right", NULL};
    ctmbstr const valuesp[] = {"texttop", "absmiddle", "absbottom",
                               "textbottom", NULL};

    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    CheckLowerCaseAttrValue( doc, node, attval );

    if (AttrValueIsAmong(attval, values))
    {
            /* all is fine */
    }
    else if (AttrValueIsAmong(attval, values2))
    {
        if (!(node->tag && (node->tag->model & CM_IMG)))
            TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
    }
    else if (AttrValueIsAmong(attval, valuesp))
    {
        TY_(ConstrainVersion)( doc, VERS_PROPRIETARY );
        TY_(ReportAttrError)( doc, node, attval, PROPRIETARY_ATTR_VALUE);
    }
    else
        TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
}